

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvParticle_dns.c
# Opt level: O3

int ComputeError(sunrealtype t,N_Vector y,N_Vector e,sunrealtype *ec,UserData udata)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  
  pdVar1 = (double *)N_VGetArrayPointer();
  pdVar2 = (double *)N_VGetArrayPointer(e);
  dVar3 = cos(udata->alpha * t);
  *pdVar2 = dVar3;
  dVar3 = sin(t * udata->alpha);
  pdVar2[1] = dVar3;
  N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,y,e,e);
  *ec = *pdVar1 * *pdVar1 + pdVar1[1] * pdVar1[1] + -1.0;
  return 0;
}

Assistant:

static int ComputeError(sunrealtype t, N_Vector y, N_Vector e, sunrealtype* ec,
                        UserData udata)
{
  sunrealtype* ydata = N_VGetArrayPointer(y);
  int retval;

  /* solution error */
  retval = ComputeSolution(t, e, udata);
  if (check_retval(&retval, "ComputeSolution", 1)) { return (1); }
  N_VLinearSum(ONE, y, -ONE, e, e);

  /* constraint error */
  *ec = ydata[0] * ydata[0] + ydata[1] * ydata[1] - ONE;

  return (0);
}